

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O2

uint32_t __thiscall Roman_int::as_int(Roman_int *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  allocator<char> local_1e9;
  string left;
  string local_1c8;
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)this,_S_out|_S_in);
  uVar1 = get_M((istream *)&ss);
  uVar2 = get_C((istream *)&ss);
  uVar3 = get_X((istream *)&ss);
  uVar4 = get_I((istream *)&ss);
  left._M_dataplus._M_p = (pointer)&left.field_2;
  left._M_string_length = 0;
  left.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ss,(string *)&left);
  if (left._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"Invalid roman numeral.",&local_1e9);
    error(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::__cxx11::string::~string((string *)&left);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return uVar3 + uVar4 + uVar2 + uVar1;
}

Assistant:

uint32_t Roman_int::as_int() const
{
	std::stringstream ss{ m_numerals };
	auto n = get_M(ss) + get_C(ss) + get_X(ss) + get_I(ss);
	std::string left;
	std::getline(ss, left);
	if (!left.empty())
	{
		error("Invalid roman numeral.");
	}
	return n;
}